

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

uint64_t aom_mse_16xh_16bit_sse2(uint8_t *dst,int dstride,uint16_t *src,int w,int h)

{
  int iVar1;
  uint64_t uVar2;
  int in_ECX;
  uint8_t *in_RDX;
  int in_R8D;
  int i;
  uint64_t sum;
  int num_blks;
  int h_00;
  uint64_t uVar3;
  undefined4 in_stack_ffffffffffffffd8;
  
  iVar1 = (int)(0x10 / (long)in_ECX);
  uVar3 = 0;
  for (h_00 = 0; h_00 < iVar1; h_00 = h_00 + 1) {
    uVar2 = aom_mse_wxh_16bit_sse2
                      (in_RDX,in_ECX,(uint16_t *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),
                       (int)(uVar3 >> 0x20),(int)uVar3,h_00);
    uVar3 = uVar2 + uVar3;
    in_RDX = in_RDX + (long)(in_ECX * in_R8D) * 2;
  }
  return uVar3;
}

Assistant:

uint64_t aom_mse_16xh_16bit_sse2(uint8_t *dst, int dstride, uint16_t *src,
                                 int w, int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must be satisfied");
  const int num_blks = 16 / w;
  uint64_t sum = 0;
  for (int i = 0; i < num_blks; i++) {
    sum += aom_mse_wxh_16bit_sse2(dst, dstride, src, w, w, h);
    dst += w;
    src += (w * h);
  }
  return sum;
}